

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSpinBarrier.cpp
# Opt level: O3

void __thiscall de::SpinBarrier::reset(SpinBarrier *this,deUint32 numThreads)

{
  this->m_numThreads = numThreads;
  this->m_numEntered = 0;
  this->m_numLeaving = 0;
  this->m_numRemoved = 0;
  return;
}

Assistant:

void SpinBarrier::reset (deUint32 numThreads)
{
	// If last threads were removed, m_numEntered > 0 && m_numRemoved > 0
	DE_ASSERT(m_numLeaving == 0);
	DE_ASSERT(numThreads > 0);
	m_numThreads = numThreads;
	m_numEntered = 0;
	m_numLeaving = 0;
	m_numRemoved = 0;
}